

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaGig.c
# Opt level: O1

int * Gia_ManGigCount(Vec_Int_t *vObjs,Vec_Int_t *vStore)

{
  int *piVar1;
  long lVar2;
  uint uVar3;
  
  Gia_ManGigCount::nObjs[4] = 0;
  Gia_ManGigCount::nObjs[5] = 0;
  Gia_ManGigCount::nObjs[6] = 0;
  Gia_ManGigCount::nObjs[7] = 0;
  Gia_ManGigCount::nObjs[0] = 0;
  Gia_ManGigCount::nObjs[1] = 0;
  Gia_ManGigCount::nObjs[2] = 0;
  Gia_ManGigCount::nObjs[3] = 0;
  Gia_ManGigCount::nObjs[8] = 0;
  Gia_ManGigCount::nObjs[9] = 0;
  if (0 < vObjs->nSize) {
    piVar1 = vObjs->pArray;
    lVar2 = 0;
    do {
      if ((piVar1[lVar2] < -1) || (uVar3 = piVar1[lVar2] + 1, vStore->nSize <= (int)uVar3)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      Gia_ManGigCount::nObjs[vStore->pArray[uVar3]] =
           Gia_ManGigCount::nObjs[vStore->pArray[uVar3]] + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 < vObjs->nSize);
  }
  return Gia_ManGigCount::nObjs;
}

Assistant:

int * Gia_ManGigCount( Vec_Int_t * vObjs, Vec_Int_t * vStore )
{
    static int nObjs[GIG_UNUSED]; int i;
    for ( i = 0; i < GIG_UNUSED; i++ )
        nObjs[i] = 0;
    for ( i = 0; i < Vec_IntSize(vObjs); i++ )
        nObjs[Vec_IntEntry(vStore, Vec_IntEntry(vObjs,i) + 1)]++;
    return nObjs;
}